

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O2

RelatedFullDocumentDiagnosticReport *
my_lsp_server::lscpp_handle_diagnostic_report
          (RelatedFullDocumentDiagnosticReport *__return_storage_ptr__,server *param_1,
          DocumentDiagnosticParams *param_2)

{
  initializer_list<lscpp::protocol::Diagnostic> __l;
  allocator_type local_ca;
  allocator<char> local_c9;
  undefined1 local_c8 [168];
  bool local_20;
  
  std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<char_const(&)[4]>
            ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,"foo");
  local_c8._0_4_ = 2;
  local_c8._4_4_ = 1;
  local_c8._8_4_ = 2;
  local_c8._12_4_ = 5;
  local_c8._16_4_ = Error;
  local_c8[0x14] = true;
  local_c8[0x40] = false;
  local_c8[0x68] = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_c8 + 0x70),"Oh that\'s stupid!",&local_c9);
  local_20 = false;
  __l._M_len = 1;
  __l._M_array = (iterator)local_c8;
  std::vector<lscpp::protocol::Diagnostic,_std::allocator<lscpp::protocol::Diagnostic>_>::vector
            (&(__return_storage_ptr__->super_FullDocumentDiagnosticReport).items,__l,&local_ca);
  lscpp::protocol::Diagnostic::~Diagnostic((Diagnostic *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

lscpp::protocol::RelatedFullDocumentDiagnosticReport
  lscpp_handle_diagnostic_report(server &,
                                 lscpp::protocol::DocumentDiagnosticParams) {
    return {{"foo",
             {lscpp::protocol::Diagnostic{
                 lscpp::protocol::Range{{2, 1}, {2, 5}},
                 lscpp::protocol::DiagnosticSeverity::Error,
                 {},
                 {},
                 "Oh that's stupid!"}}}};
  }